

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O3

int __thiscall sc_core::sc_plist_base::remove(sc_plist_base *this,char *__filename)

{
  long lVar1;
  long lVar2;
  handle_t psVar3;
  sc_plist_base *psVar4;
  int iVar5;
  
  psVar3 = this->head;
  if (psVar3 == (handle_t)__filename) {
    iVar5 = (int)psVar3->data;
    this->head = psVar3->next;
    sc_mempool::release(psVar3,0x18);
    psVar3 = this->head;
    if (this->head == (handle_t)0x0) {
      psVar3 = (handle_t)this;
    }
    psVar3->prev = (handle_t)0x0;
  }
  else {
    psVar3 = this->tail;
    if (psVar3 == (handle_t)__filename) {
      iVar5 = (int)psVar3->data;
      this->tail = psVar3->prev;
      sc_mempool::release(psVar3,0x18);
      psVar4 = (sc_plist_base *)&this->tail->next;
      if (this->tail == (handle_t)0x0) {
        psVar4 = this;
      }
      psVar4->head = (handle_t)0x0;
    }
    else {
      iVar5 = (int)*(undefined8 *)__filename;
      lVar1 = *(long *)(__filename + 8);
      lVar2 = *(long *)(__filename + 0x10);
      *(long *)(lVar1 + 0x10) = lVar2;
      *(long *)(lVar2 + 8) = lVar1;
      sc_mempool::release(__filename,0x18);
    }
  }
  return iVar5;
}

Assistant:

void*
sc_plist_base::remove( handle_t h )
{
    if (h == head)
        return pop_front();
    else if (h == tail)
        return pop_back();
    else {
        void* d = h->data;
        h->prev->next = h->next;
        h->next->prev = h->prev;
        delete h;
        return d;
    }
}